

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cpp
# Opt level: O1

list<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
StackTrace::return_stack_trace_abi_cxx11_
          (list<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          StackTrace *this,size_t address)

{
  __int_type_conflict _Var1;
  undefined1 auVar2 [16];
  int spin_count;
  uint uVar3;
  iterator iVar4;
  pair<unsigned_long,_unsigned_long> data;
  ulong local_30;
  pair<unsigned_long,_unsigned_long> local_28;
  
  uVar3 = 0;
  local_30 = address;
  do {
    if (((this->lock)._locked._M_base._M_i & 1U) == 0) {
      LOCK();
      _Var1 = (this->lock)._locked._M_base._M_i;
      (this->lock)._locked._M_base._M_i = true;
      UNLOCK();
      if ((_Var1 & 1U) == 0) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_30;
        iVar4 = phmap::container_internal::
                raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                ::find<unsigned_long>
                          ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                            *)this,&local_30,
                           SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,8) +
                           SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,0));
        if (iVar4.ctrl_ ==
            (this->_read_write).
            super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
            .
            super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
            .ctrl_ + (this->_read_write).
                     super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                     .
                     super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                     .capacity_) {
          (__return_storage_ptr__->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>).
          _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
          (__return_storage_ptr__->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>).
          _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
          (__return_storage_ptr__->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>).
          _M_impl._M_node._M_size = 0;
          (__return_storage_ptr__->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>).
          _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
          (__return_storage_ptr__->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>).
          _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
        }
        else {
          local_28.first = *(unsigned_long *)((long)iVar4.field_1.slot_ + 8);
          local_28.second = *(unsigned_long *)((long)iVar4.field_1.slot_ + 0x10);
          make_trace_abi_cxx11_(__return_storage_ptr__,this,&local_28);
        }
        (this->lock)._locked._M_base._M_i = false;
        return __return_storage_ptr__;
      }
    }
    if (0xf < uVar3) {
      sched_yield();
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

std::list<size_t> StackTrace::return_stack_trace(size_t address) const {
  std::lock_guard<ipc::spinlock> lg(lock);
  auto it = _read_write.find(address);
  if (it != _read_write.end()) {
    auto data = it->second;
    return make_trace(data);
  }
  // A read/write operation was not tracked correctly -> return empty stack
  // trace
  return {};
}